

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O3

void __thiscall FMultiPatchTexture::~FMultiPatchTexture(FMultiPatchTexture *this)

{
  FRemapTable *this_00;
  int iVar1;
  TexPart *pTVar2;
  long lVar3;
  long lVar4;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FMultiPatchTexture_0088c8c0;
  if (this->Pixels != (BYTE *)0x0) {
    operator_delete__(this->Pixels);
    this->Pixels = (BYTE *)0x0;
  }
  pTVar2 = this->Parts;
  if (pTVar2 == (TexPart *)0x0) goto LAB_006595c2;
  iVar1 = this->NumParts;
  if (iVar1 < 1) {
LAB_006595b2:
    operator_delete__(pTVar2);
  }
  else {
    lVar4 = 8;
    lVar3 = 0;
    do {
      this_00 = *(FRemapTable **)((long)&this->Parts->OriginX + lVar4);
      if (this_00 != (FRemapTable *)0x0) {
        FRemapTable::~FRemapTable(this_00);
        operator_delete(this_00,0x20);
        iVar1 = this->NumParts;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar3 < iVar1);
    pTVar2 = this->Parts;
    if (pTVar2 != (TexPart *)0x0) goto LAB_006595b2;
  }
  this->Parts = (TexPart *)0x0;
LAB_006595c2:
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FMultiPatchTexture::~FMultiPatchTexture ()
{
	Unload ();
	if (Parts != NULL)
	{
		for(int i=0; i<NumParts;i++)
		{
			if (Parts[i].Translation != NULL) delete Parts[i].Translation;
		}
		delete[] Parts;
		Parts = NULL;
	}
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}